

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M68KInstPrinter.c
# Opt level: O0

void registerBits(SStream *O,cs_m68k_op *op)

{
  long in_RSI;
  SStream *in_RDI;
  uint data;
  char buffer [128];
  undefined1 local_98 [8];
  char *in_stack_ffffffffffffff70;
  uint32_t in_stack_ffffffffffffff7c;
  char *in_stack_ffffffffffffff80;
  
  local_98[0] = 0;
  if (*(int *)(in_RSI + 0x2c) == 0) {
    SStream_concat(in_RDI,"%s","#$0");
  }
  else {
    printRegbitsRange(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,in_stack_ffffffffffffff70)
    ;
    printRegbitsRange(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,in_stack_ffffffffffffff70)
    ;
    printRegbitsRange(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,in_stack_ffffffffffffff70)
    ;
    SStream_concat(in_RDI,"%s",local_98);
  }
  return;
}

Assistant:

static void registerBits(SStream* O, const cs_m68k_op* op)
{
	char buffer[128];
	unsigned int data = op->register_bits;

	buffer[0] = 0;

	if (!data) {
		SStream_concat(O, "%s", "#$0");
		return;
	}

	printRegbitsRange(buffer, data & 0xff, "d");
	printRegbitsRange(buffer, (data >> 8) & 0xff, "a");
	printRegbitsRange(buffer, (data >> 16) & 0xff, "fp");

	SStream_concat(O, "%s", buffer);
}